

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O1

QString * encodeByteArray(QString *__return_storage_ptr__,QCborContainerPrivate *d,qsizetype idx,
                         QCborTag encoding)

{
  Element *pEVar1;
  Data *pDVar2;
  Data *data;
  QString *pQVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArray local_48;
  QByteArray local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar1 = (d->elements).d.ptr;
  if ((pEVar1[idx].flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
       super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 2) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
LAB_002f4a49:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pcVar4 = (d->data).d.ptr;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "";
    }
    local_28.d.ptr = pcVar4 + pEVar1[idx].field_0.value + 8;
    local_28.d.size = *(qsizetype *)(pcVar4 + pEVar1[idx].field_0.value);
    local_28.d.d = (Data *)0x0;
    if (encoding == 0x16) {
      QByteArray::toBase64(&local_48,&local_28,(Base64Options)0x0);
    }
    else if (encoding == 0x17) {
      QByteArray::toHex(&local_48,&local_28,'\0');
    }
    else {
      QByteArray::toBase64(&local_48,&local_28,(Base64Options)0x3);
    }
    pcVar4 = local_28.d.ptr;
    data = local_28.d.d;
    pQVar3 = (QString *)local_48.d.size;
    pDVar2 = local_48.d.d;
    local_48.d.d = local_28.d.d;
    local_28.d.d = pDVar2;
    local_28.d.ptr = local_48.d.ptr;
    local_48.d.ptr = pcVar4;
    local_48.d.size = local_28.d.size;
    local_28.d.size = (qsizetype)pQVar3;
    if (&data->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&data->super_QArrayData,1,0x10);
      }
    }
    ba.m_data = (storage_type *)pQVar3;
    ba.m_size = (qsizetype)local_28.d.ptr;
    QString::fromLatin1(__return_storage_ptr__,(QString *)local_28.d.size,ba);
    if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) goto LAB_002f4a49;
  }
  return __return_storage_ptr__;
}

Assistant:

static QString encodeByteArray(const QCborContainerPrivate *d, qsizetype idx, QCborTag encoding)
{
    const ByteData *b = d->byteData(idx);
    if (!b)
        return QString();

    QByteArray data = QByteArray::fromRawData(b->byte(), b->len);
    if (encoding == QCborKnownTags::ExpectedBase16)
        data = data.toHex();
    else if (encoding == QCborKnownTags::ExpectedBase64)
        data = data.toBase64();
    else
        data = data.toBase64(QByteArray::Base64UrlEncoding | QByteArray::OmitTrailingEquals);

    return QString::fromLatin1(data);
}